

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void in2_a2(DisasContext_conflict13 *s,DisasOps *o)

{
  int x2;
  int b2;
  int d2;
  TCGv_i64 pTVar1;
  
  x2 = 0;
  if (((s->fields).presentO & 0x4000) != 0) {
    x2 = get_field1(s,FLD_O_x2,FLD_C_d4);
  }
  b2 = get_field1(s,FLD_O_b2,FLD_C_b2);
  d2 = get_field1(s,FLD_O_d2,FLD_C_d2);
  pTVar1 = get_address(s,x2,b2,d2);
  o->in2 = pTVar1;
  return;
}

Assistant:

static void in2_a2(DisasContext *s, DisasOps *o)
{
    int x2 = have_field(s, x2) ? get_field(s, x2) : 0;
    o->in2 = get_address(s, x2, get_field(s, b2), get_field(s, d2));
}